

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
glcts::LayoutBindingBaseCase::makeSparseRange
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,LayoutBindingBaseCase *this,
          int maxElement,int minElement)

{
  float fVar1;
  bool bVar2;
  int iVar3;
  reference pvVar4;
  reference pfVar5;
  undefined4 in_register_00000014;
  int local_74;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_70;
  const_iterator local_68;
  float local_5c;
  iterator iStack_58;
  float e;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_50;
  iterator it;
  float range;
  float max;
  vector<float,_std::allocator<float>_> rangeTemplate;
  int minElement_local;
  int maxElement_local;
  LayoutBindingBaseCase *this_local;
  vector<int,_std::allocator<int>_> *result;
  
  rangeTemplate.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = minElement;
  rangeTemplate.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = maxElement;
  makeVector<float,6ul>
            ((vector<float,_std::allocator<float>_> *)&range,(glcts *)makeSparseRange::rangeT,
             (float (*) [6])CONCAT44(in_register_00000014,maxElement));
  pvVar4 = std::vector<float,_std::allocator<float>_>::back
                     ((vector<float,_std::allocator<float>_> *)&range);
  fVar1 = *pvVar4;
  iVar3 = (rangeTemplate.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + -1) -
          (int)rangeTemplate.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
  it._M_current._7_1_ = 0;
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__);
  local_50._M_current =
       (float *)std::vector<float,_std::allocator<float>_>::begin
                          ((vector<float,_std::allocator<float>_> *)&range);
  while( true ) {
    iStack_58 = std::vector<float,_std::allocator<float>_>::end
                          ((vector<float,_std::allocator<float>_> *)&range);
    bVar2 = __gnu_cxx::operator!=(&local_50,&stack0xffffffffffffffa8);
    if (!bVar2) break;
    pfVar5 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
             operator*(&local_50);
    local_5c = (*pfVar5 * (float)iVar3) / fVar1;
    local_70._M_current = (int *)std::vector<int,_std::allocator<int>_>::end(__return_storage_ptr__)
    ;
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_68,
               &local_70);
    local_74 = (int)rangeTemplate.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + (int)local_5c;
    std::vector<int,_std::allocator<int>_>::insert(__return_storage_ptr__,local_68,&local_74);
    __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::operator++
              (&local_50,0);
  }
  it._M_current._7_1_ = 1;
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)&range);
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> makeSparseRange(int maxElement, int minElement = 0) const
	{
		static float	   rangeT[]		 = { 0.0f, 0.1f, 0.5f, 0.6f, 0.9f, 1.0f };
		std::vector<float> rangeTemplate = makeVector(rangeT);
		float			   max			 = rangeTemplate.back();
		float			   range		 = (float)((maxElement - 1) - minElement);

		std::vector<int> result;
		for (std::vector<float>::iterator it = rangeTemplate.begin(); it != rangeTemplate.end(); it++)
		{
			float e = *it;
			e		= (e * range) / max;
			result.insert(result.end(), minElement + (int)e);
		}
		return result;
	}